

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::checkIoArrayConsistency
          (TParseContext *this,TSourceLoc *loc,int requiredSize,char *feature,TType *type,
          TString *name)

{
  EShLanguage EVar1;
  int iVar2;
  char *pcVar3;
  pointer pcVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  iVar2 = (*type->_vptr_TType[0x1f])(type);
  if ((char)iVar2 != '\0') {
    TType::changeOuterArraySize(type,requiredSize);
    return;
  }
  iVar2 = (*type->_vptr_TType[0xf])(type);
  if (iVar2 != requiredSize) {
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar1 == EShLangTessControl) {
      pcVar4 = (name->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar3 = "inconsistent output number of vertices for array size of";
    }
    else if (EVar1 == EShLangMesh) {
      pcVar4 = (name->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar3 = "inconsistent output array size of";
    }
    else if (EVar1 == EShLangFragment) {
      iVar2 = (*type->_vptr_TType[0xf])(type);
      if (iVar2 <= requiredSize) {
        return;
      }
      pcVar4 = (name->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar3 = " cannot be greater than 3 for pervertexEXT";
    }
    else {
      if (EVar1 != EShLangGeometry) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                      ,0x371,
                      "void glslang::TParseContext::checkIoArrayConsistency(const TSourceLoc &, int, const char *, TType &, const TString &)"
                     );
      }
      pcVar4 = (name->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar3 = "inconsistent input primitive for array size of";
    }
    (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar3,feature,pcVar4,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void TParseContext::checkIoArrayConsistency(const TSourceLoc& loc, int requiredSize, const char* feature, TType& type, const TString& name)
{
    if (type.isUnsizedArray())
        type.changeOuterArraySize(requiredSize);
    else if (type.getOuterArraySize() != requiredSize) {
        if (language == EShLangGeometry)
            error(loc, "inconsistent input primitive for array size of", feature, name.c_str());
        else if (language == EShLangTessControl)
            error(loc, "inconsistent output number of vertices for array size of", feature, name.c_str());
        else if (language == EShLangFragment) {
            if (type.getOuterArraySize() > requiredSize)
                error(loc, " cannot be greater than 3 for pervertexEXT", feature, name.c_str());
        }
        else if (language == EShLangMesh)
            error(loc, "inconsistent output array size of", feature, name.c_str());
        else
            assert(0);
    }
}